

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpx_helper.c
# Opt level: O3

uint32_t lookup_bte32(CPUX86State *env,uint32_t base,uintptr_t ra)

{
  uint uVar1;
  uint32_t uVar2;
  
  uVar1 = ((uint)env->bnd_regs[(ulong)((~env->hflags & 3) != 0) + 4].lb & 0xfffff000) +
          (base >> 0xc) * 4;
  uVar2 = cpu_ldl_data_ra_x86_64(env,(ulong)uVar1,ra);
  if ((uVar2 & 1) != 0) {
    return (uVar2 & 0xfffffffc) + (base & 0xffc) * 4;
  }
  (env->bndcs_regs).sts = (ulong)(uVar1 | 2);
  raise_exception_ra_x86_64(env,5,ra);
}

Assistant:

static uint32_t lookup_bte32(CPUX86State *env, uint32_t base, uintptr_t ra)
{
    uint32_t bndcsr, bde, bt;

    if ((env->hflags & HF_CPL_MASK) == 3) {
        bndcsr = env->bndcs_regs.cfgu;
    } else {
        bndcsr = env->msr_bndcfgs;
    }

    bde = (extract32(base, 12, 20) << 2) + (bndcsr & TARGET_PAGE_MASK);
    bt = cpu_ldl_data_ra(env, bde, ra);
    if ((bt & 1) == 0) {
        env->bndcs_regs.sts = bde | 2;
        raise_exception_ra(env, EXCP05_BOUND, ra);
    }

    return (extract32(base, 2, 10) << 4) + (bt & ~3);
}